

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void AdditionHelper<unsigned_short,char,5>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_short *lhs,char *rhs,unsigned_short *result)

{
  if ((int)*rhs + (uint)*lhs < 0x10000) {
    *result = (unsigned_short)((int)*rhs + (uint)*lhs);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 16-bit or less - one or both are signed
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() && tmp >= (std::int32_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }